

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::KeyData::DerivePubkey
          (KeyData *__return_storage_ptr__,KeyData *this,string *path,bool has_rebase_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  allocator local_71;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"KeyData::DerivePubkey",&local_71);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,path,&local_40,
                    '\0');
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  DerivePubkey(__return_storage_ptr__,this,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,has_rebase_path);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePubkey(std::string path, bool has_rebase_path) const {
  auto arr = ToArrayFromString(path, "KeyData::DerivePubkey", 0);
  return DerivePubkey(arr, has_rebase_path);
}